

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

int rf_get_size_base64(uchar *input)

{
  long local_20;
  rf_int i;
  int size;
  uchar *input_local;
  
  i._4_4_ = 0;
  for (local_20 = 0; input[local_20 * 4] != '\0'; local_20 = local_20 + 1) {
    if (input[local_20 * 4 + 3] == '=') {
      if (input[local_20 * 4 + 2] == '=') {
        i._4_4_ = i._4_4_ + 1;
      }
      else {
        i._4_4_ = i._4_4_ + 2;
      }
    }
    else {
      i._4_4_ = i._4_4_ + 3;
    }
  }
  return i._4_4_;
}

Assistant:

RF_API int rf_get_size_base64(const unsigned char *input)
{
    int size = 0;

    for (rf_int i = 0; input[4 * i] != 0; i++)
    {
        if (input[4 * i + 3] == '=')
        {
            if (input[4 * i + 2] == '=') size += 1;
            else size += 2;
        } else size += 3;
    }

    return size;
}